

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  InternalKey begin_storage;
  InternalKey end_storage;
  InternalKey local_c8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  ManualCompaction local_88;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x247,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (5 < (uint)level) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/db_impl.cc"
                  ,0x248,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  local_a8 = local_98;
  psVar2 = (string *)0x0;
  local_a0 = 0;
  local_98[0] = 0;
  local_48 = 0;
  local_40[0] = 0;
  paVar1 = &local_88.tmp_storage.rep_.field_2;
  local_88.tmp_storage.rep_._M_string_length = 0;
  local_88.tmp_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_88.done = false;
  local_88.level = level;
  local_88.tmp_storage.rep_._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  if (begin != (Slice *)0x0) {
    InternalKey::InternalKey(&local_c8,begin,0xffffffffffffff,kTypeValue);
    psVar2 = (string *)&local_a8;
    std::__cxx11::string::operator=(psVar2,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.rep_._M_dataplus._M_p != &local_c8.rep_.field_2) {
      operator_delete(local_c8.rep_._M_dataplus._M_p);
    }
  }
  local_88.begin = (InternalKey *)psVar2;
  if (end == (Slice *)0x0) {
    psVar2 = (string *)0x0;
  }
  else {
    InternalKey::InternalKey(&local_c8,end,0,kTypeDeletion);
    psVar2 = (string *)&local_50;
    std::__cxx11::string::operator=(psVar2,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.rep_._M_dataplus._M_p != &local_c8.rep_.field_2) {
      operator_delete(local_c8.rep_._M_dataplus._M_p);
    }
  }
  local_88.end = (InternalKey *)psVar2;
  port::Mutex::Lock(&this->mutex_);
  if (local_88.done == false) {
    do {
      if ((this->shutting_down_).rep_ != (void *)0x0 || (this->bg_error_).state_ != (char *)0x0)
      break;
      if (this->manual_compaction_ == (ManualCompaction *)0x0) {
        this->manual_compaction_ = &local_88;
        MaybeScheduleCompaction(this);
      }
      else {
        port::CondVar::Wait(&this->bg_cv_);
      }
    } while (local_88.done != true);
  }
  if (this->manual_compaction_ == &local_88) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  port::Mutex::Unlock(&this->mutex_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tmp_storage.rep_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.tmp_storage.rep_._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice *begin, const Slice *end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin==NULL) {
    manual.begin = NULL;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end==NULL) {
    manual.end = NULL;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.Acquire_Load() && bg_error_.ok()) {
    if (manual_compaction_==NULL) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      bg_cv_.Wait();
    }
  }
  if (manual_compaction_==&manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = NULL;
  }
}